

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
KTXHeader::ToStringArray_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,KTXHeader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  undefined8 *puVar6;
  long *plVar7;
  long lVar8;
  size_type *psVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  string __str;
  string gl_internal_format_string;
  string gl_base_internal_format_string;
  string gl_type_string;
  string gl_format_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  value_type local_130;
  value_type local_110;
  value_type local_f0;
  value_type local_d0;
  char *local_b0;
  uint local_a8;
  char local_a0 [16];
  char *local_90;
  uint local_88;
  char local_80 [16];
  char *local_70;
  uint local_68;
  char local_60 [16];
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"0 (compressed format)","");
  uVar2 = (this->impl_).gl_format;
  if (uVar2 != 0) {
    if (KTXInfo::gl_enum_names_abi_cxx11_._16_8_ == 0) {
      lVar11 = 0x143340;
    }
    else {
      lVar8 = 0x143340;
      lVar11 = KTXInfo::gl_enum_names_abi_cxx11_._16_8_;
      do {
        bVar12 = *(uint *)(lVar11 + 0x20) < uVar2;
        if (!bVar12) {
          lVar8 = lVar11;
        }
        lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar12 * 8);
      } while (lVar11 != 0);
      lVar11 = 0x143340;
      if ((lVar8 != 0x143340) && (lVar11 = 0x143340, *(uint *)(lVar8 + 0x20) <= uVar2)) {
        lVar11 = lVar8;
      }
    }
    iVar5 = std::__cxx11::string::compare((char *)(lVar11 + 0x28));
    if (iVar5 == 0) {
      uVar2 = (this->impl_).gl_format;
      cVar4 = '\x01';
      if (9 < uVar2) {
        uVar10 = uVar2;
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar10 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_0012e45b;
          }
          if (uVar10 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_0012e45b;
          }
          if (uVar10 < 10000) goto LAB_0012e45b;
          bVar12 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar12);
        cVar4 = cVar4 + '\x01';
      }
LAB_0012e45b:
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_50,local_48,uVar2);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_130.field_2._M_allocated_capacity = *psVar9;
        local_130.field_2._8_8_ = plVar7[3];
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar9;
        local_130._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_130._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
    }
    else {
      if (KTXInfo::gl_enum_names_abi_cxx11_._16_8_ == 0) {
        lVar11 = 0x143340;
      }
      else {
        uVar2 = (this->impl_).gl_format;
        lVar8 = 0x143340;
        lVar11 = KTXInfo::gl_enum_names_abi_cxx11_._16_8_;
        do {
          bVar12 = *(uint *)(lVar11 + 0x20) < uVar2;
          if (!bVar12) {
            lVar8 = lVar11;
          }
          lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar12 * 8);
        } while (lVar11 != 0);
        lVar11 = 0x143340;
        if ((lVar8 != 0x143340) && (lVar11 = 0x143340, *(uint *)(lVar8 + 0x20) <= uVar2)) {
          lVar11 = lVar8;
        }
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,*(long *)(lVar11 + 0x28),
                 *(long *)(lVar11 + 0x30) + *(long *)(lVar11 + 0x28));
    }
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((iVar5 == 0) && (local_50 != local_40)) {
      operator_delete(local_50);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_d0);
  if (KTXInfo::gl_enum_names_abi_cxx11_._16_8_ == 0) {
    lVar11 = 0x143340;
  }
  else {
    uVar2 = (this->impl_).gl_internal_format;
    lVar8 = 0x143340;
    lVar11 = KTXInfo::gl_enum_names_abi_cxx11_._16_8_;
    do {
      bVar12 = *(uint *)(lVar11 + 0x20) < uVar2;
      if (!bVar12) {
        lVar8 = lVar11;
      }
      lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar12 * 8);
    } while (lVar11 != 0);
    lVar11 = 0x143340;
    if ((lVar8 != 0x143340) && (lVar11 = 0x143340, *(uint *)(lVar8 + 0x20) <= uVar2)) {
      lVar11 = lVar8;
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)(lVar11 + 0x28));
  if (iVar5 == 0) {
    uVar2 = (this->impl_).gl_internal_format;
    cVar4 = '\x01';
    if (9 < uVar2) {
      uVar10 = uVar2;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar10 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_0012e669;
        }
        if (uVar10 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_0012e669;
        }
        if (uVar10 < 10000) goto LAB_0012e669;
        bVar12 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar12);
      cVar4 = cVar4 + '\x01';
    }
LAB_0012e669:
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_70,local_68,uVar2);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    psVar9 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130.field_2._8_8_ = puVar6[3];
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar9;
      local_130._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_130._M_string_length = puVar6[1];
    *puVar6 = psVar9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
  }
  else {
    if (KTXInfo::gl_enum_names_abi_cxx11_._16_8_ == 0) {
      lVar11 = 0x143340;
    }
    else {
      uVar2 = (this->impl_).gl_internal_format;
      lVar8 = 0x143340;
      lVar11 = KTXInfo::gl_enum_names_abi_cxx11_._16_8_;
      do {
        bVar12 = *(uint *)(lVar11 + 0x20) < uVar2;
        if (!bVar12) {
          lVar8 = lVar11;
        }
        lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar12 * 8);
      } while (lVar11 != 0);
      lVar11 = 0x143340;
      if ((lVar8 != 0x143340) && (lVar11 = 0x143340, *(uint *)(lVar8 + 0x20) <= uVar2)) {
        lVar11 = lVar8;
      }
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,*(long *)(lVar11 + 0x28),
               *(long *)(lVar11 + 0x30) + *(long *)(lVar11 + 0x28));
  }
  if ((iVar5 == 0) && (local_70 != local_60)) {
    operator_delete(local_70);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_130);
  if (KTXInfo::gl_enum_names_abi_cxx11_._16_8_ == 0) {
    lVar11 = 0x143340;
  }
  else {
    uVar2 = (this->impl_).gl_base_internal_format;
    lVar8 = 0x143340;
    lVar11 = KTXInfo::gl_enum_names_abi_cxx11_._16_8_;
    do {
      bVar12 = *(uint *)(lVar11 + 0x20) < uVar2;
      if (!bVar12) {
        lVar8 = lVar11;
      }
      lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar12 * 8);
    } while (lVar11 != 0);
    lVar11 = 0x143340;
    if ((lVar8 != 0x143340) && (lVar11 = 0x143340, *(uint *)(lVar8 + 0x20) <= uVar2)) {
      lVar11 = lVar8;
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)(lVar11 + 0x28));
  if (iVar5 == 0) {
    uVar2 = (this->impl_).gl_base_internal_format;
    cVar4 = '\x01';
    if (9 < uVar2) {
      uVar10 = uVar2;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar10 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_0012e84d;
        }
        if (uVar10 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_0012e84d;
        }
        if (uVar10 < 10000) goto LAB_0012e84d;
        bVar12 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar12);
      cVar4 = cVar4 + '\x01';
    }
LAB_0012e84d:
    local_90 = local_80;
    std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_90,local_88,uVar2);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar7[3];
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_110._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
  }
  else {
    if (KTXInfo::gl_enum_names_abi_cxx11_._16_8_ == 0) {
      lVar11 = 0x143340;
    }
    else {
      uVar2 = (this->impl_).gl_base_internal_format;
      lVar8 = 0x143340;
      lVar11 = KTXInfo::gl_enum_names_abi_cxx11_._16_8_;
      do {
        bVar12 = *(uint *)(lVar11 + 0x20) < uVar2;
        if (!bVar12) {
          lVar8 = lVar11;
        }
        lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar12 * 8);
      } while (lVar11 != 0);
      lVar11 = 0x143340;
      if ((lVar8 != 0x143340) && (lVar11 = 0x143340, *(uint *)(lVar8 + 0x20) <= uVar2)) {
        lVar11 = lVar8;
      }
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,*(long *)(lVar11 + 0x28),
               *(long *)(lVar11 + 0x30) + *(long *)(lVar11 + 0x28));
  }
  if ((iVar5 == 0) && (local_90 != local_80)) {
    operator_delete(local_90);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_110);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"0 (compressed format)","");
  uVar2 = (this->impl_).gl_type;
  if (uVar2 != 0) {
    if (KTXInfo::gl_enum_names_abi_cxx11_._16_8_ == 0) {
      lVar11 = 0x143340;
    }
    else {
      lVar8 = 0x143340;
      lVar11 = KTXInfo::gl_enum_names_abi_cxx11_._16_8_;
      do {
        bVar12 = *(uint *)(lVar11 + 0x20) < uVar2;
        if (!bVar12) {
          lVar8 = lVar11;
        }
        lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar12 * 8);
      } while (lVar11 != 0);
      lVar11 = 0x143340;
      if ((lVar8 != 0x143340) && (lVar11 = 0x143340, *(uint *)(lVar8 + 0x20) <= uVar2)) {
        lVar11 = lVar8;
      }
    }
    iVar5 = std::__cxx11::string::compare((char *)(lVar11 + 0x28));
    if (iVar5 == 0) {
      uVar2 = (this->impl_).gl_type;
      cVar4 = '\x01';
      if (9 < uVar2) {
        uVar10 = uVar2;
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar10 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_0012ea5a;
          }
          if (uVar10 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_0012ea5a;
          }
          if (uVar10 < 10000) goto LAB_0012ea5a;
          bVar12 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar12);
        cVar4 = cVar4 + '\x01';
      }
LAB_0012ea5a:
      local_b0 = local_a0;
      std::__cxx11::string::_M_construct((ulong)&local_b0,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_b0,local_a8,uVar2);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_150.field_2._M_allocated_capacity = *psVar9;
        local_150.field_2._8_8_ = plVar7[3];
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar9;
        local_150._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_150._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
    }
    else {
      if (KTXInfo::gl_enum_names_abi_cxx11_._16_8_ == 0) {
        lVar11 = 0x143340;
      }
      else {
        uVar2 = (this->impl_).gl_type;
        lVar8 = 0x143340;
        lVar11 = KTXInfo::gl_enum_names_abi_cxx11_._16_8_;
        do {
          bVar12 = *(uint *)(lVar11 + 0x20) < uVar2;
          if (!bVar12) {
            lVar8 = lVar11;
          }
          lVar11 = *(long *)(lVar11 + 0x10 + (ulong)bVar12 * 8);
        } while (lVar11 != 0);
        lVar11 = 0x143340;
        if ((lVar8 != 0x143340) && (lVar11 = 0x143340, *(uint *)(lVar8 + 0x20) <= uVar2)) {
          lVar11 = lVar8;
        }
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,*(long *)(lVar11 + 0x28),
                 *(long *)(lVar11 + 0x30) + *(long *)(lVar11 + 0x28));
    }
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((iVar5 == 0) && (local_b0 != local_a0)) {
      operator_delete(local_b0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_f0);
  uVar2 = (this->impl_).gl_type_size;
  cVar4 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012eb81;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012eb81;
      }
      if (uVar10 < 10000) goto LAB_0012eb81;
      bVar12 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar12);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012eb81:
  paVar1 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  uVar2 = (this->impl_).pixel_width;
  cVar4 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012ec18;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012ec18;
      }
      if (uVar10 < 10000) goto LAB_0012ec18;
      bVar12 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar12);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012ec18:
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  uVar2 = (this->impl_).pixel_height;
  cVar4 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012eca8;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012eca8;
      }
      if (uVar10 < 10000) goto LAB_0012eca8;
      bVar12 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar12);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012eca8:
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  uVar2 = (this->impl_).pixel_depth;
  cVar4 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012ed38;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012ed38;
      }
      if (uVar10 < 10000) goto LAB_0012ed38;
      bVar12 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar12);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012ed38:
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  uVar2 = (this->impl_).number_of_array_elements;
  cVar4 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012edc8;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012edc8;
      }
      if (uVar10 < 10000) goto LAB_0012edc8;
      bVar12 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar12);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012edc8:
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  uVar2 = (this->impl_).number_of_faces;
  cVar4 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012ee58;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012ee58;
      }
      if (uVar10 < 10000) goto LAB_0012ee58;
      bVar12 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar12);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012ee58:
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  uVar2 = (this->impl_).number_of_mipmap_levels;
  cVar4 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012eee8;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012eee8;
      }
      if (uVar10 < 10000) goto LAB_0012eee8;
      bVar12 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar12);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012eee8:
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  uVar2 = (this->impl_).bytes_of_key_value_data;
  cVar4 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012ef78;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012ef78;
      }
      if (uVar10 < 10000) goto LAB_0012ef78;
      bVar12 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar12);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012ef78:
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  uVar2 = (this->impl_).endianness;
  cVar4 = '\x01';
  if (9 < uVar2) {
    uVar10 = uVar2;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar10 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0012f008;
      }
      if (uVar10 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0012f008;
      }
      if (uVar10 < 10000) goto LAB_0012f008;
      bVar12 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar12);
    cVar4 = cVar4 + '\x01';
  }
LAB_0012f008:
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_150,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> ToStringArray() {
    std::vector<std::string> output;
    const auto& impl(this->impl_);
    std::string gl_format_string("0 (compressed format)");
    if(impl.gl_format != 0) gl_format_string = ENUM_STRING_LOOKUP(KTXInfo::gl_enum_names,impl.gl_format);
    output.push_back(gl_format_string);
    std::string gl_internal_format_string(ENUM_STRING_LOOKUP(KTXInfo::gl_enum_names,impl.gl_internal_format));
    output.push_back(gl_internal_format_string);
    std::string gl_base_internal_format_string(ENUM_STRING_LOOKUP(KTXInfo::gl_enum_names,impl.gl_base_internal_format));
    output.push_back(gl_base_internal_format_string);
    std::string gl_type_string("0 (compressed format)");
    if(impl.gl_type != 0) gl_type_string = ENUM_STRING_LOOKUP(KTXInfo::gl_enum_names,impl.gl_type);
    output.push_back(gl_type_string);
    output.push_back(std::to_string(impl.gl_type_size));
    output.push_back(std::to_string(impl.pixel_width));
    output.push_back(std::to_string(impl.pixel_height));
    output.push_back(std::to_string(impl.pixel_depth));
    output.push_back(std::to_string(impl.number_of_array_elements));
    output.push_back(std::to_string(impl.number_of_faces));
    output.push_back(std::to_string(impl.number_of_mipmap_levels));
    output.push_back(std::to_string(impl.bytes_of_key_value_data));
    output.push_back(std::to_string(impl.endianness));
    return output;
  }